

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_escaping.cc
# Opt level: O1

void google::protobuf::util::converter::JsonEscaping::Escape(ByteSource *input,ByteSink *output)

{
  uint uVar1;
  ulong uVar2;
  undefined3 uVar3;
  undefined4 uVar4;
  byte bVar5;
  undefined1 uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t size;
  undefined4 extraout_var_01;
  int iVar8;
  long extraout_RDX;
  uint uVar9;
  long i;
  uint uVar10;
  ulong unaff_R12;
  undefined7 uVar11;
  uint uVar12;
  ulong uVar13;
  StringPiece local_80;
  ulong local_70;
  ByteSink *local_68;
  ByteSource *local_60;
  uint local_54;
  char *local_50;
  uint local_44;
  undefined8 local_40;
  char buffer [12];
  
  local_40 = 0x755c64616564755c;
  builtin_strncpy(buffer,"bee",4);
  local_68 = output;
  iVar7 = (*input->_vptr_ByteSource[2])();
  if (CONCAT44(extraout_var,iVar7) != 0) {
    uVar12 = 0;
    local_44 = 0;
    local_60 = input;
    do {
      iVar7 = (*input->_vptr_ByteSource[3])();
      local_50 = (char *)0x0;
      size = 0;
      uVar13 = 0;
      uVar9 = local_44;
      do {
        uVar10 = 0;
        iVar8 = (int)uVar13;
        local_80.ptr_ = (char *)CONCAT44(extraout_var_00,iVar7);
        local_80.length_ = extraout_RDX;
        local_70 = uVar13;
        if (uVar9 == 0) {
          bVar5 = StringPiece::operator[](&local_80,(long)iVar8);
          uVar12 = (uint)bVar5;
          uVar10 = 1;
          if ((char)bVar5 < '\0') {
            if (0xbf < bVar5) {
              iVar8 = iVar8 + 1;
              if (bVar5 < 0xe0) {
                uVar12 = uVar12 & 0x1f;
                uVar9 = 1;
              }
              else if (bVar5 < 0xf0) {
                uVar12 = uVar12 & 0xf;
                uVar9 = 2;
              }
              else {
                if (0xf7 < bVar5) goto LAB_0031825a;
                uVar12 = uVar12 & 7;
                uVar9 = 3;
              }
              goto LAB_003181bd;
            }
LAB_0031825a:
            unaff_R12 = 0;
          }
          else {
            unaff_R12 = CONCAT71((int7)(unaff_R12 >> 8),1);
          }
        }
        else {
LAB_003181bd:
          local_54 = (int)uVar9 >> 0x1f & uVar9;
          i = (long)iVar8;
          do {
            uVar11 = (undefined7)(unaff_R12 >> 8);
            if (local_54 == uVar9) {
              unaff_R12 = CONCAT71(uVar11,uVar12 < 0x110000 && (uVar12 & 0xfffff800) != 0xd800);
              uVar9 = local_54;
              break;
            }
            unaff_R12 = CONCAT71(uVar11,local_80.length_ <= i);
            if (local_80.length_ <= i) break;
            bVar5 = StringPiece::operator[](&local_80,i);
            uVar9 = uVar9 - 1;
            uVar10 = uVar10 + 1;
            uVar12 = uVar12 << 6 | (uint)(bVar5 & 0x3f);
            i = i + 1;
          } while ((char)bVar5 < -0x40);
        }
        uVar13 = local_70;
        if ((0 < (int)uVar9) || ((char)unaff_R12 == '\0')) goto LAB_00318562;
        if (uVar12 < 0xa0) {
          local_50 = (anonymous_namespace)::kCommonEscapes + (ulong)uVar12 * 7;
          size = strlen(local_50);
          if ((long)size < 0) {
            local_54 = (uint)unaff_R12;
            StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
            unaff_R12 = (ulong)local_54;
          }
        }
        else {
          if ((int)uVar12 < 0xfeff) {
            if (0x17b3 < (int)uVar12) {
              if (1 < uVar12 - 0x17b4) goto LAB_00318430;
              goto LAB_0031832f;
            }
            if (((uVar12 == 0xad) || (uVar12 == 0x6dd)) || (uVar12 == 0x70f)) goto LAB_0031832f;
LAB_00318430:
            if ((((uVar12 & 0xfffffffc) == 0x600) ||
                ((uVar12 - 0x200b < 0x24 &&
                 ((0xfe000001fU >> ((ulong)(uVar12 - 0x200b) & 0x3f) & 1) != 0)))) ||
               ((uVar12 - 0x2060 < 0x10 && ((0xfc1fU >> (uVar12 - 0x2060 & 0x1f) & 1) != 0))))
            goto LAB_0031832f;
            if ((0x5f < uVar12 - 0xe0020) && (7 < uVar12 - 0x1d173)) {
              local_50 = (char *)0x0;
              size = 0;
              if (uVar12 != 0xe0001) goto LAB_0031837a;
            }
            uVar1 = (uVar12 >> 10) - 0x2840;
            buffer[3] = "0123456789abcdef"[uVar12 & 0xf];
            buffer[2] = "0123456789abcdef"[uVar12 >> 4 & 0xf];
            buffer[1] = "0123456789abcdef"[(ulong)(uVar12 >> 8 & 3) + 0xc];
            buffer[0] = 'd';
            local_40._0_3_ =
                 CONCAT12("0123456789abcdef"[(uVar1 & 0xffff) >> 0xc],(undefined2)local_40);
            local_40 = CONCAT53(CONCAT41(CONCAT31(CONCAT21(local_40._6_2_,
                                                           "0123456789abcdef"[uVar12 >> 10 & 0xf]),
                                                  "0123456789abcdef"[uVar1 >> 4 & 0xf]),
                                         "0123456789abcdef"[uVar1 >> 8 & 0xf]),(undefined3)local_40)
            ;
            size = 0xc;
          }
          else {
            if ((2 < uVar12 - 0xfff9) && (uVar12 != 0xfeff)) goto LAB_00318430;
LAB_0031832f:
            local_40._0_3_ =
                 CONCAT12("0123456789abcdef"[(uVar12 & 0xffff) >> 0xc],(undefined2)local_40);
            local_40 = CONCAT53(CONCAT41(CONCAT31(CONCAT21(local_40._6_2_,
                                                           "0123456789abcdef"[uVar12 & 0xf]),
                                                  "0123456789abcdef"[uVar12 >> 4 & 0xf]),
                                         "0123456789abcdef"[uVar12 >> 8 & 0xf]),(undefined3)local_40
                               );
            size = 6;
          }
          local_50 = (char *)&local_40;
        }
LAB_0031837a:
        if ((0 < (int)local_44) && (size == 0)) {
          uVar2 = CONCAT26(local_40._6_2_,CONCAT15((char)uVar12,(undefined5)local_40)) &
                  0xffff3fffffffffff;
          uVar3 = (undefined3)(uVar2 >> 0x28);
          uVar6 = (undefined1)(uVar12 >> 6);
          local_40._0_4_ = (undefined4)uVar2;
          if (uVar12 < 0x800) {
            local_40 = CONCAT35(uVar3,CONCAT14(uVar6,(undefined4)local_40)) | 0x80c000000000;
            size = 2;
            local_50 = (char *)((long)&local_40 + 4);
          }
          else {
            uVar2 = CONCAT35(uVar3,CONCAT14(uVar6,(undefined4)local_40)) & 0xffffff3fffffffff;
            uVar4 = (undefined4)(uVar2 >> 0x20);
            uVar6 = (undefined1)(uVar12 >> 0xc);
            local_40._0_3_ = (undefined3)uVar2;
            if (uVar12 < 0x10000) {
              local_40 = CONCAT44(uVar4,CONCAT13(uVar6,(undefined3)local_40)) | 0x8080e0000000;
              size = 3;
              local_50 = (char *)((long)&local_40 + 3);
            }
            else {
              uVar2 = CONCAT44(uVar4,CONCAT13(uVar6,(undefined3)local_40)) & 0xffffffff3fffffff;
              local_40._0_2_ = (undefined2)uVar2;
              local_40 = CONCAT53((int5)(uVar2 >> 0x18),
                                  CONCAT12((char)(uVar12 >> 0x12),(undefined2)local_40)) &
                         0xffffffffff07ffff | 0x808080f00000;
              size = 4;
              local_50 = (char *)((long)&local_40 + 2);
            }
          }
        }
        if (size != 0) goto LAB_00318562;
        uVar10 = (int)uVar13 + uVar10;
        uVar13 = (ulong)uVar10;
      } while ((int)uVar10 < extraout_RDX);
      uVar10 = 0;
LAB_00318562:
      if (0 < (int)uVar13) {
        (*local_60->_vptr_ByteSource[5])(local_60,local_68,uVar13 & 0xffffffff);
      }
      if (0 < (int)uVar10) {
        (*local_60->_vptr_ByteSource[4])(local_60,(ulong)uVar10);
      }
      input = local_60;
      local_44 = 0;
      uVar10 = local_44;
      if ((((char)unaff_R12 != '\0') && (uVar10 = uVar9, uVar9 == 0)) && (size != 0)) {
        (*local_68->_vptr_ByteSink[2])(local_68,local_50,size);
      }
      local_44 = uVar10;
      iVar7 = (*input->_vptr_ByteSource[2])(input);
    } while (CONCAT44(extraout_var_01,iVar7) != 0);
  }
  return;
}

Assistant:

void JsonEscaping::Escape(strings::ByteSource* input,
                          strings::ByteSink* output) {
  char buffer[12] = "\\udead\\ubee";
  uint32 cp = 0;     // Current unicode code point.
  int num_left = 0;  // Num of chars to read to complete the code point.
  while (input->Available() > 0) {
    StringPiece str = input->Peek();
    StringPiece escaped;
    int i = 0;
    int num_read;
    bool ok;
    bool cp_was_split = num_left > 0;
    // Loop until we encounter either
    //   i) a code point that needs to be escaped; or
    //  ii) a split code point is completely read; or
    // iii) a character that is not a valid utf8; or
    //  iv) end of the StringPiece str is reached.
    do {
      ok = ReadCodePoint(str, i, &cp, &num_left, &num_read);
      if (num_left > 0 || !ok) break;  // case iii or iv
      escaped = EscapeCodePoint(cp, buffer, cp_was_split);
      if (!escaped.empty()) break;  // case i or ii
      i += num_read;
      num_read = 0;
    } while (i < str.length());  // case iv
    // First copy the un-escaped prefix, if any, to the output ByteSink.
    if (i > 0) input->CopyTo(output, i);
    if (num_read > 0) input->Skip(num_read);
    if (!ok) {
      // Case iii: Report error.
      // TODO(wpoon): Add error reporting.
      num_left = 0;
    } else if (num_left == 0 && !escaped.empty()) {
      // Case i or ii: Append the escaped code point to the output ByteSink.
      output->Append(escaped.data(), escaped.size());
    }
  }
  if (num_left > 0) {
    // Treat as case iii: report error.
    // TODO(wpoon): Add error reporting.
  }
}